

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O1

void Fl::set_boxtype(Fl_Boxtype t,Fl_Box_Draw_F *f,uchar a,uchar b,uchar c,uchar d)

{
  fl_box_table[t].f = f;
  fl_box_table[t].set = 1;
  fl_box_table[t].dx = a;
  fl_box_table[t].dy = b;
  fl_box_table[t].dw = c;
  fl_box_table[t].dh = d;
  return;
}

Assistant:

void Fl::set_boxtype(Fl_Boxtype t, Fl_Box_Draw_F* f,
		      uchar a, uchar b, uchar c, uchar d) {
  fl_box_table[t].f   = f;
  fl_box_table[t].set = 1;
  fl_box_table[t].dx  = a;
  fl_box_table[t].dy  = b;
  fl_box_table[t].dw  = c;
  fl_box_table[t].dh  = d;
}